

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  ImFont *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImFontGlyph *pIVar4;
  ImDrawList *in_RCX;
  float *in_RDX;
  ImVec2 *in_RSI;
  long in_RDI;
  char *in_R8;
  undefined8 *in_R9;
  float in_XMM0_Da;
  float fVar5;
  ImVec2 IVar6;
  float in_XMM1_Da;
  int i;
  float ellipsis_x;
  float text_size_clipped_x;
  float text_avail_width;
  float spacing_between_dots;
  float ellipsis_total_width;
  float ellipsis_glyph_width;
  ImFontGlyph *glyph;
  int ellipsis_char_count;
  ImWchar ellipsis_char;
  char *text_end_ellipsis;
  float font_size;
  ImFont *font;
  ImVec2 text_size;
  ImGuiContext *g;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char **in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  ImVec2 *pos;
  char *in_stack_ffffffffffffff10;
  ImVec2 *in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImDrawList *in_stack_ffffffffffffff28;
  ImVec2 *in_stack_ffffffffffffff30;
  ImVec2 *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  ImRect *in_stack_ffffffffffffff58;
  float local_9c;
  float local_94;
  float local_8c;
  float local_84;
  float local_78;
  float local_74;
  uint local_68;
  ImWchar local_62;
  ImDrawList *local_60;
  float local_48;
  char *local_30;
  
  pIVar1 = GImGui;
  local_30 = in_R8;
  if (in_R8 == (char *)0x0) {
    local_30 = FindRenderedTextEnd((char *)in_RCX,(char *)0x0);
  }
  if (in_R9 == (undefined8 *)0x0) {
    IVar6 = CalcTextSize(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0),
                         (float)in_stack_fffffffffffffed8);
    local_48 = IVar6.x;
  }
  else {
    local_48 = (float)*in_R9;
  }
  if (local_48 <= *in_RDX - in_RSI->x) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff3c,in_XMM0_Da,in_RDX[1]);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff34,0.0,0.0);
    RenderTextClippedEx(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                        (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18,
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff58);
  }
  else {
    this = *(ImFont **)(*(long *)(in_RDI + 0x38) + 8);
    local_60 = (ImDrawList *)0x0;
    local_62 = this->EllipsisChar;
    local_68 = 1;
    if (local_62 == 0xffff) {
      local_62 = this->DotChar;
      local_68 = 3;
    }
    pIVar4 = ImFont::FindGlyph(this,local_62);
    local_78 = pIVar4->X1;
    local_74 = local_78;
    if (1 < local_68) {
      fVar5 = (*(float *)(*(long *)(in_RDI + 0x38) + 0x10) / this->FontSize) * 1.0;
      local_74 = (pIVar4->X1 - pIVar4->X0) + fVar5;
      local_78 = local_74 * (float)local_68 + -fVar5;
    }
    fVar5 = ImMax<float>(*in_RDX,in_XMM1_Da);
    ImMax<float>((fVar5 - local_78) - in_RSI->x,1.0);
    IVar6 = ImFont::CalcTextSizeA
                      ((ImFont *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                       in_stack_ffffffffffffff20,(float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
                      );
    local_8c = IVar6.x;
    local_84 = local_8c;
    if ((in_RCX == (ImDrawList *)0x0) && (local_30 != (char *)0x0)) {
      in_stack_ffffffffffffff28 = in_RCX;
      iVar3 = ImTextCountUtf8BytesFromChar(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      local_60 = (ImDrawList *)((long)&(in_stack_ffffffffffffff28->CmdBuffer).Size + (long)iVar3);
      IVar6 = ImFont::CalcTextSizeA
                        ((ImFont *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                         in_stack_ffffffffffffff20,(float)((ulong)in_stack_ffffffffffffff18 >> 0x20)
                         ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00);
      local_94 = IVar6.x;
      local_84 = local_94;
    }
    while( true ) {
      in_stack_ffffffffffffff24 = (float)((uint)in_stack_ffffffffffffff24 & 0xffffff);
      if (in_RCX < local_60) {
        bVar2 = ImCharIsBlankA(local_60[-1].field_0xc7);
        in_stack_ffffffffffffff24 = (float)CONCAT13(bVar2,SUB43(in_stack_ffffffffffffff24,0));
      }
      if ((char)((uint)in_stack_ffffffffffffff24 >> 0x18) == '\0') break;
      local_60 = (ImDrawList *)&local_60[-1].field_0xc7;
      IVar6 = ImFont::CalcTextSizeA
                        ((ImFont *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                         in_stack_ffffffffffffff20,(float)((ulong)in_stack_ffffffffffffff18 >> 0x20)
                         ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00);
      local_9c = IVar6.x;
      local_84 = local_84 - local_9c;
    }
    pos = in_RSI;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,in_XMM0_Da,in_RDX[1]);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,0.0,0.0);
    RenderTextClippedEx(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                        (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (ImVec2 *)local_60,
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff50 = in_RSI->x + local_84;
    if (in_stack_ffffffffffffff50 + local_78 <= in_XMM1_Da) {
      for (in_stack_ffffffffffffff4c = 0; in_stack_ffffffffffffff4c < (int)local_68;
          in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c + 1) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44,in_stack_ffffffffffffff50,in_RSI->y);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                    (float)in_stack_fffffffffffffed0);
        ImFont::RenderChar((ImFont *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           local_60,(float)((ulong)in_RCX >> 0x20),pos,
                           (ImU32)((ulong)in_RDI >> 0x20),(ImWchar)((ulong)in_RDI >> 0x10));
        in_stack_ffffffffffffff50 = local_74 + in_stack_ffffffffffffff50;
      }
    }
  }
  if ((pIVar1->LogEnabled & 1U) != 0) {
    LogRenderedText((ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    (char *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = font->DotChar;
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}